

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
phyr::Film::Film(Film *this,Point2i *resolution,Bounds2f *cropWindow,
                unique_ptr<phyr::Filter,_std::default_delete<phyr::Filter>_> *_filter,
                double filmSize,string *filename,double scale)

{
  undefined8 *puVar1;
  Filter *pFVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer __p;
  pointer __p_00;
  Point2<int> PVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  Point2<int> PVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  __uniq_ptr_impl<phyr::Film::Pixel,_std::default_delete<phyr::Film::Pixel[]>_> local_48;
  double dStack_40;
  
  this->resolution = *resolution;
  this->filmSize = filmSize * 0.001;
  (this->filter)._M_t.super___uniq_ptr_impl<phyr::Filter,_std::default_delete<phyr::Filter>_>._M_t.
  super__Tuple_impl<0UL,_phyr::Filter_*,_std::default_delete<phyr::Filter>_>.
  super__Head_base<0UL,_phyr::Filter_*,_false>._M_head_impl =
       (_filter->_M_t).super___uniq_ptr_impl<phyr::Filter,_std::default_delete<phyr::Filter>_>._M_t.
       super__Tuple_impl<0UL,_phyr::Filter_*,_std::default_delete<phyr::Filter>_>.
       super__Head_base<0UL,_phyr::Filter_*,_false>._M_head_impl;
  (_filter->_M_t).super___uniq_ptr_impl<phyr::Filter,_std::default_delete<phyr::Filter>_>._M_t.
  super__Tuple_impl<0UL,_phyr::Filter_*,_std::default_delete<phyr::Filter>_>.
  super__Head_base<0UL,_phyr::Filter_*,_false>._M_head_impl = (Filter *)0x0;
  std::__cxx11::string::string((string *)&this->filename,(string *)filename);
  (this->croppedImageBounds).pMin.x = -0x80000000;
  (this->croppedImageBounds).pMin.y = -0x80000000;
  (this->croppedImageBounds).pMax.x = 0x7fffffff;
  (this->croppedImageBounds).pMax.y = 0x7fffffff;
  this->scale = scale;
  (this->pixels)._M_t.
  super___uniq_ptr_impl<phyr::Film::Pixel,_std::default_delete<phyr::Film::Pixel[]>_>._M_t.
  super__Tuple_impl<0UL,_phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>.
  super__Head_base<0UL,_phyr::Film::Pixel_*,_false>._M_head_impl = (Pixel *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  iVar13 = resolution->x;
  dVar3 = ceil((cropWindow->pMin).x * (double)iVar13);
  iVar9 = (int)dVar3;
  iVar6 = resolution->y;
  dVar3 = ceil((cropWindow->pMin).y * (double)iVar6);
  iVar11 = (int)dVar3;
  dVar3 = ceil((double)iVar13 * (cropWindow->pMax).x);
  iVar13 = (int)dVar3;
  dVar3 = ceil((double)iVar6 * (cropWindow->pMax).y);
  iVar6 = (int)dVar3;
  iVar5 = iVar9;
  if (iVar13 < iVar9) {
    iVar5 = iVar13;
  }
  iVar4 = iVar11;
  if (iVar6 < iVar11) {
    iVar4 = iVar6;
  }
  PVar7.y = iVar4;
  PVar7.x = iVar5;
  if (iVar13 < iVar9) {
    iVar13 = iVar9;
  }
  if (iVar6 < iVar11) {
    iVar6 = iVar11;
  }
  PVar14.y = iVar6;
  PVar14.x = iVar13;
  (this->croppedImageBounds).pMin = PVar7;
  (this->croppedImageBounds).pMax = PVar14;
  iVar13 = Bounds2<int>::area(&this->croppedImageBounds);
  uVar8 = 0xffffffffffffffff;
  if (-1 < iVar13) {
    uVar8 = (long)iVar13 << 6;
  }
  __p_00 = (pointer)operator_new__(uVar8);
  if (iVar13 != 0) {
    uVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)__p_00->xyz + uVar8 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)__p_00->xyz + uVar8 + 0x30) = 0;
      puVar1 = (undefined8 *)((long)__p_00->xyz + uVar8 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)__p_00->xyz + uVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar8 = uVar8 + 0x40;
    } while ((long)iVar13 << 6 != uVar8);
  }
  local_48._M_t.
  super__Tuple_impl<0UL,_phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>.
  super__Head_base<0UL,_phyr::Film::Pixel_*,_false>._M_head_impl =
       (tuple<phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>)
       (_Tuple_impl<0UL,_phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>)0x0;
  std::__uniq_ptr_impl<phyr::Film::Pixel,_std::default_delete<phyr::Film::Pixel[]>_>::reset
            ((__uniq_ptr_impl<phyr::Film::Pixel,_std::default_delete<phyr::Film::Pixel[]>_> *)
             &this->pixels,__p_00);
  std::unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_>::~unique_ptr
            ((unique_ptr<phyr::Film::Pixel[],_std::default_delete<phyr::Film::Pixel[]>_> *)&local_48
            );
  lVar12 = 0;
  for (iVar13 = 0; iVar13 != 0x10; iVar13 = iVar13 + 1) {
    for (lVar10 = 0; (int)lVar10 != 0x10; lVar10 = lVar10 + 1) {
      pFVar2 = (this->filter)._M_t.
               super___uniq_ptr_impl<phyr::Filter,_std::default_delete<phyr::Filter>_>._M_t.
               super__Tuple_impl<0UL,_phyr::Filter_*,_std::default_delete<phyr::Filter>_>.
               super__Head_base<0UL,_phyr::Filter_*,_false>._M_head_impl;
      local_48._M_t.
      super__Tuple_impl<0UL,_phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>.
      super__Head_base<0UL,_phyr::Film::Pixel_*,_false>._M_head_impl =
           (tuple<phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>)
           ((pFVar2->radius).x * ((double)(int)lVar10 + 0.5) * 0.0625);
      dStack_40 = (pFVar2->radius).y * ((double)iVar13 + 0.5) * 0.0625;
      (*pFVar2->_vptr_Filter[2])(pFVar2,&local_48);
      this->filterTable[(int)lVar12 + lVar10] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    lVar12 = (int)lVar12 + lVar10;
  }
  return;
}

Assistant:

Film::Film(const Point2i& resolution, const Bounds2f& cropWindow,
           std::unique_ptr<Filter> _filter, Real filmSize,
           const std::string& filename, Real scale) :
    resolution(resolution), filmSize(filmSize * .001), filter(std::move(_filter)),
    filename(filename), scale(scale) {
    // Compute film image bounds
    croppedImageBounds = Bounds2i(Point2i(std::ceil(resolution.x * cropWindow.pMin.x),
                                          std::ceil(resolution.y * cropWindow.pMin.y)),
                                  Point2i(std::ceil(resolution.x * cropWindow.pMax.x),
                                          std::ceil(resolution.y * cropWindow.pMax.y)));

    // Allocate memory for image pixels
    pixels = std::unique_ptr<Pixel[]>(new Pixel[croppedImageBounds.area()]);

    // Precompute filter weight table
    Real invFilterTableSize = Real(1) / filterTableSize;
    int offset = 0;

    for (int y = 0; y < filterTableSize; y++) {
        for (int x = 0; x < filterTableSize; x++) {
            Real px, py;
            px = (x + 0.5) * filter->radius.x * invFilterTableSize;
            py = (y + 0.5) * filter->radius.y * invFilterTableSize;
            filterTable[offset++] = filter->evaluate(Point2f(px, py));
        }
    }
}